

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

DriveStrengthSyntax * __thiscall slang::parsing::Parser::parseDriveStrength(Parser *this)

{
  bool bVar1;
  bool bVar2;
  Diagnostic *this_00;
  DriveStrengthSyntax *pDVar3;
  DiagCode code;
  Token openParen;
  Token TVar4;
  Token comma;
  Token TVar5;
  Token closeParen;
  SourceRange SVar6;
  Token strength0;
  Token strength1;
  anon_class_8_1_8991fb9c expectStrength;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    expectStrength.this = this;
    openParen = ParserBase::consume(&this->super_ParserBase);
    TVar4 = parseDriveStrength::anon_class_8_1_8991fb9c::operator()(&expectStrength,Strong1Keyword);
    strength0 = TVar4;
    comma = ParserBase::expect(&this->super_ParserBase,Comma);
    TVar5 = parseDriveStrength::anon_class_8_1_8991fb9c::operator()(&expectStrength,Strong0Keyword);
    strength1 = TVar5;
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    bVar1 = slang::syntax::SyntaxFacts::isStrength0(TVar4.kind);
    bVar2 = slang::syntax::SyntaxFacts::isStrength0(TVar5.kind);
    code.subsystem = Parser;
    code.code = 0x23;
    if ((bVar1 == bVar2) ||
       (code.subsystem = Parser, code.code = 0x22,
       (TVar5._0_8_ & 0xfffe) == 0xb4 && (TVar4._0_8_ & 0xfffe) == 0xb4)) {
      SVar6 = Token::range(&strength1);
      this_00 = ParserBase::addDiag(&this->super_ParserBase,code,SVar6);
      SVar6 = Token::range(&strength0);
      Diagnostic::operator<<(this_00,SVar6);
    }
    pDVar3 = slang::syntax::SyntaxFactory::driveStrength
                       (&this->factory,openParen,strength0,comma,strength1,closeParen);
  }
  else {
    pDVar3 = (DriveStrengthSyntax *)0x0;
  }
  return pDVar3;
}

Assistant:

DriveStrengthSyntax* Parser::parseDriveStrength() {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto expectStrength = [&](TokenKind defaultKind) {
        Token next = peek();
        if (isDriveStrength(next.kind))
            return consume();

        addDiag(diag::ExpectedNetStrength, next.location());
        return missingToken(defaultKind, next.location());
    };

    auto openParen = consume();
    auto strength0 = expectStrength(TokenKind::Strong1Keyword);
    auto comma = expect(TokenKind::Comma);
    auto strength1 = expectStrength(TokenKind::Strong0Keyword);
    auto closeParen = expect(TokenKind::CloseParenthesis);

    if (isStrength0(strength0.kind) == isStrength0(strength1.kind))
        addDiag(diag::DriveStrengthInvalid, strength1.range()) << strength0.range();
    else if (isHighZ(strength0) && isHighZ(strength1))
        addDiag(diag::DriveStrengthHighZ, strength1.range()) << strength0.range();

    return &factory.driveStrength(openParen, strength0, comma, strength1, closeParen);
}